

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O2

bool __thiscall Potassco::AspifInput::doAttach(AspifInput *this,bool *inc)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  BufferedStream *this_00;
  
  bVar1 = ProgramReader::match(&this->super_ProgramReader,"asp ",true);
  if (bVar1) {
    uVar3 = ProgramReader::matchPos
                      (&this->super_ProgramReader,0xffffffff,"unsigned integer expected");
    ProgramReader::require(&this->super_ProgramReader,uVar3 == 1,"unsupported major version");
    uVar3 = ProgramReader::matchPos
                      (&this->super_ProgramReader,0xffffffff,"unsigned integer expected");
    ProgramReader::require(&this->super_ProgramReader,uVar3 == 0,"unsupported minor version");
    ProgramReader::matchPos(&this->super_ProgramReader,"revision number expected");
    do {
      bVar1 = ProgramReader::match(&this->super_ProgramReader," ",false);
    } while (bVar1);
    bVar1 = ProgramReader::match(&this->super_ProgramReader,"incremental",false);
    *inc = bVar1;
    (*this->out_->_vptr_AbstractProgram[2])(this->out_,(ulong)bVar1);
    this_00 = ProgramReader::stream(&this->super_ProgramReader);
    cVar2 = BufferedStream::get(this_00);
    bVar1 = ProgramReader::require
                      (&this->super_ProgramReader,cVar2 == '\n',
                       "invalid extra characters in problem line");
    return bVar1;
  }
  return false;
}

Assistant:

bool AspifInput::doAttach(bool& inc) {
	if (!match("asp ")) { return false; }
	require(matchPos() == 1, "unsupported major version");
	require(matchPos() == 0, "unsupported minor version");
	matchPos("revision number expected");
	while (match(" ", false)) { ; }
	inc  = match("incremental", false);
	out_.initProgram(inc);
	return require(stream()->get() == '\n', "invalid extra characters in problem line");
}